

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall Game::setRegularTeams(Game *this)

{
  bool bVar1;
  reference __x;
  reference local_58 [2];
  Card local_38;
  vector<Card,_std::allocator<Card>_> local_30;
  ulong local_18;
  size_t i;
  Game *this_local;
  
  i = (size_t)this;
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    __x = std::
          vector<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
          ::at(&this->m_playerCards,local_18);
    std::vector<Card,_std::allocator<Card>_>::vector(&local_30,__x);
    Card::Card(&local_38,CLUBS,QUEEN);
    bVar1 = contains<Card>(&local_30,local_38);
    std::vector<Card,_std::allocator<Card>_>::~vector(&local_30);
    if (bVar1) {
      local_58[0] = std::vector<bool,_std::allocator<bool>_>::at(&this->m_teams,local_18);
      std::_Bit_reference::operator=(local_58,true);
    }
  }
  return;
}

Assistant:

void Game::setRegularTeams() {
    //regular rules:
    for (size_t i = 0; i < NUMPLAYERS; i++) {
        if (contains(m_playerCards.at(i), Card(Suit::CLUBS, CardValue::QUEEN)))
            m_teams.at(i) = true;
    }
}